

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

Llb_Img_t * Llb_CoreStart(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  Llb_Img_t *p_00;
  DdManager *pDVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Llb_Img_t *p;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pInit_local;
  
  p_00 = (Llb_Img_t *)calloc(1,0x78);
  p_00->pInit = pInit;
  p_00->pAig = pAig;
  p_00->pPars = pPars;
  uVar1 = Aig_ManObjNumMax(pAig);
  pDVar2 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->dd = pDVar2;
  uVar1 = Aig_ManRegNum(pAig);
  pDVar2 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->ddG = pDVar2;
  uVar1 = Aig_ManCiNum(pAig);
  pDVar2 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->ddR = pDVar2;
  Cudd_AutodynEnable(p_00->dd,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(p_00->ddG,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(p_00->ddR,CUDD_REORDER_SYMM_SIFT);
  pVVar3 = Vec_PtrAlloc(100);
  p_00->vRings = pVVar3;
  pVVar4 = Llb_DriverCountRefs(pAig);
  p_00->vDriRefs = pVVar4;
  pVVar4 = Llb_DriverCollectCs(pAig);
  p_00->vVarsCs = pVVar4;
  pVVar4 = Llb_DriverCollectNs(pAig,p_00->vDriRefs);
  p_00->vVarsNs = pVVar4;
  Llb_CoreSetVarMaps(p_00);
  return p_00;
}

Assistant:

Llb_Img_t * Llb_CoreStart( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t *  pPars )
{
    Llb_Img_t * p;
    p = ABC_CALLOC( Llb_Img_t, 1 );
    p->pInit = pInit;
    p->pAig  = pAig;
    p->pPars = pPars;
    p->dd    = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddG   = Cudd_Init( Aig_ManRegNum(pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR   = Cudd_Init( Aig_ManCiNum(pAig),     0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    p->vRings = Vec_PtrAlloc( 100 );
    p->vDriRefs = Llb_DriverCountRefs( pAig );
    p->vVarsCs  = Llb_DriverCollectCs( pAig );
    p->vVarsNs  = Llb_DriverCollectNs( pAig, p->vDriRefs );
    Llb_CoreSetVarMaps( p );
    return p;
}